

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

void save_dungeon(memfile *mf)

{
  branch **ppbVar1;
  int value;
  long lVar2;
  dungeon *buf;
  
  mtag(mf,0,MTAG_DUNGEON);
  mfmagic_set(mf,0x4e4744);
  mwrite32(mf,n_dgns);
  buf = dungeons;
  for (lVar2 = 0; lVar2 < n_dgns; lVar2 = lVar2 + 1) {
    mtag(mf,(long)buf->ledger_start,MTAG_DUNGEONSTRUCT);
    mwrite(mf,buf,0x18);
    mwrite(mf,buf->proto,0xf);
    mwrite8(mf,buf->boneid);
    save_d_flags(mf,buf->flags);
    mwrite8(mf,buf->entry_lev);
    mwrite8(mf,buf->num_dunlevs);
    mwrite8(mf,buf->dunlev_ureached);
    mwrite32(mf,buf->ledger_start);
    mwrite32(mf,buf->depth_start);
    buf = buf + 1;
  }
  mwrite(mf,&dungeon_topology,0x3e);
  mwrite(mf,tune,6);
  ppbVar1 = &branches;
  value = -1;
  do {
    ppbVar1 = &((branch *)ppbVar1)->next->next;
    value = value + 1;
  } while ((branch *)ppbVar1 != (branch *)0x0);
  mwrite32(mf,value);
  ppbVar1 = &branches;
  while (ppbVar1 = &((branch *)ppbVar1)->next->next, (branch *)ppbVar1 != (branch *)0x0) {
    mtag(mf,(long)((branch *)ppbVar1)->id,MTAG_BRANCH);
    mwrite32(mf,((branch *)ppbVar1)->id);
    mwrite32(mf,((branch *)ppbVar1)->type);
    mwrite(mf,&((branch *)ppbVar1)->end1,2);
    mwrite(mf,&((branch *)ppbVar1)->end2,2);
    mwrite8(mf,((branch *)ppbVar1)->end1_up);
  }
  mwrite(mf,&inv_pos,2);
  return;
}

Assistant:

void save_dungeon(struct memfile *mf)
{
    branch *curr;
    int    count, i;

    mtag(mf, 0, MTAG_DUNGEON);
    mfmagic_set(mf, DGN_MAGIC);

    mwrite32(mf, n_dgns);
    for (i = 0; i < n_dgns; i++)
	save_dungeon_struct(mf, &dungeons[i]);

    /* writing dungeon_topology directly should be ok, it's just a
	* fancy collection of single byte values */
    mwrite(mf, &dungeon_topology, sizeof dungeon_topology);
    mwrite(mf, tune, sizeof tune);

    for (count = 0, curr = branches; curr; curr = curr->next)
	count++;
    mwrite32(mf, count);

    for (curr = branches; curr; curr = curr->next)
	save_branch(mf, curr);

    mwrite(mf, &inv_pos, sizeof(coord));
}